

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

_Bool ox_buffer_write(buffer_s *self,char *data,size_t len)

{
  ulong uVar1;
  byte bVar2;
  char *__dest;
  ulong uVar3;
  
  bVar2 = 0;
  while( true ) {
    uVar1 = self->write_pos;
    uVar3 = self->data_len - uVar1;
    if (len <= uVar3) break;
    if (self->read_pos + uVar3 < len) goto LAB_001418cc;
    ox_buffer_adjustto_head(self);
    bVar2 = 1;
  }
  if (uVar1 < self->data_len) {
    __dest = self->data + uVar1;
  }
  else {
    __dest = (char *)0x0;
  }
  memcpy(__dest,data,len);
  uVar1 = self->write_pos + len;
  if (uVar1 <= self->data_len) {
    self->write_pos = uVar1;
  }
LAB_001418cc:
  return (_Bool)(bVar2 | len <= uVar3);
}

Assistant:

bool 
ox_buffer_write(struct buffer_s* self, const char* data, size_t len)
{
    bool write_ret = true;

    if(ox_buffer_getwritevalidcount(self) >= len)
    {
        /*  直接写入    */
        memcpy(ox_buffer_getwriteptr(self), data, len);
        ox_buffer_addwritepos(self, len);
    }
    else
    {
        size_t left_len = self->data_len - ox_buffer_getreadvalidcount(self);
        if(left_len >= len)
        {
            ox_buffer_adjustto_head(self);
            ox_buffer_write(self, data, len);
        }
        else
        {
            write_ret = false;
        }
    }

    return write_ret;
}